

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

iterator * __thiscall
google::
dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
::find<HashObject<8,8>>
          (iterator *__return_storage_ptr__,
          dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
          *this,HashObject<8,_8> *key)

{
  long lVar1;
  long lVar2;
  pair<unsigned_long,_unsigned_long> pVar3;
  
  if (*(long *)(this + 0x38) != *(long *)(this + 0x30)) {
    pVar3 = find_position<HashObject<8,8>>(this,key);
    if (pVar3.first != 0xffffffffffffffff) {
      lVar1 = *(long *)(this + 0x50);
      lVar2 = *(long *)(this + 0x40);
      __return_storage_ptr__->ht =
           (dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            *)this;
      __return_storage_ptr__->pos = (pointer)(pVar3.first * 0xc + lVar1);
      __return_storage_ptr__->end = (pointer)(lVar2 * 0xc + lVar1);
      return __return_storage_ptr__;
    }
  }
  dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::end(__return_storage_ptr__,
        (dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
         *)this);
  return __return_storage_ptr__;
}

Assistant:

iterator find(const K& key) {
    if (size() == 0) return end();
    std::pair<size_type, size_type> pos = find_position(key);
    if (pos.first == ILLEGAL_BUCKET)  // alas, not there
      return end();
    else
      return iterator(this, table + pos.first, table + num_buckets, false);
  }